

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeopyramid.h
# Opt level: O3

void pzgeom::TPZGeoPyramid::GradX<double>
               (TPZFMatrix<double> *nodes,TPZVec<double> *loc,TPZFMatrix<double> *gradx)

{
  long lVar1;
  int j;
  long lVar2;
  int i;
  long lVar3;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  TPZFNMatrix<15,_double> dphi;
  TPZFNMatrix<5,_double> phi;
  TPZFMatrix<double> local_200;
  double local_170 [16];
  TPZFMatrix<double> local_f0;
  double local_60 [6];
  
  (*(gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (gradx,3,3);
  (*(gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
            (gradx);
  local_f0.fElem = local_60;
  local_f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 5;
  local_f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_f0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018885c0;
  local_f0.fSize = 5;
  local_f0.fGiven = local_f0.fElem;
  TPZVec<int>::TPZVec(&local_f0.fPivot.super_TPZVec<int>,0);
  local_f0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_f0.fPivot.super_TPZVec<int>.fStore = local_f0.fPivot.fExtAlloc;
  local_f0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_f0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_f0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_f0.fWork.fStore = (double *)0x0;
  local_f0.fWork.fNElements = 0;
  local_f0.fWork.fNAlloc = 0;
  local_f0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018882d0;
  local_200.fElem = local_170;
  local_200.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_200.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 5;
  local_200.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_200.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_200.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01888f80;
  local_200.fSize = 0xf;
  local_200.fGiven = local_200.fElem;
  TPZVec<int>::TPZVec(&local_200.fPivot.super_TPZVec<int>,0);
  local_200.fPivot.super_TPZVec<int>.fStore = local_200.fPivot.fExtAlloc;
  local_200.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_200.fPivot.super_TPZVec<int>.fNElements = 0;
  local_200.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_200.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_200.fWork.fStore = (double *)0x0;
  local_200.fWork.fNElements = 0;
  local_200.fWork.fNAlloc = 0;
  local_200.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01888c90;
  pztopology::TPZPyramid::TShape<double>(loc,&local_f0,&local_200);
  lVar3 = 0;
  do {
    lVar2 = 0;
    do {
      (*(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24]
      )(nodes,lVar2,lVar3);
      if ((local_200.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
         (local_200.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar3)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar2) ||
         ((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      gradx->fElem[lVar2] =
           extraout_XMM0_Qa *
           local_200.fElem[local_200.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar3] +
           gradx->fElem[lVar2];
      (*(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24]
      )(nodes,lVar2,lVar3);
      if ((local_200.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
         (local_200.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar3)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar1 = (gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar1 <= lVar2) || ((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      gradx->fElem[lVar1 + lVar2] =
           extraout_XMM0_Qa_00 *
           local_200.fElem[local_200.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar3 + 1] +
           gradx->fElem[lVar1 + lVar2];
      (*(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24]
      )(nodes,lVar2,lVar3);
      if ((local_200.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 3) ||
         (local_200.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar3)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar1 = (gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar1 <= lVar2) || ((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      gradx->fElem[lVar1 * 2 + lVar2] =
           extraout_XMM0_Qa_01 *
           local_200.fElem[local_200.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar3 + 2] +
           gradx->fElem[lVar1 * 2 + lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    lVar3 = lVar3 + 1;
    if (lVar3 == 5) {
      TPZFMatrix<double>::~TPZFMatrix(&local_200,&PTR_PTR_01888f48);
      TPZFMatrix<double>::~TPZFMatrix(&local_f0,&PTR_PTR_01888588);
      return;
    }
  } while( true );
}

Assistant:

inline void TPZGeoPyramid::GradX(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc, TPZFMatrix<T> &gradx){
        
        gradx.Resize(3,3);
        gradx.Zero();
        int nrow = nodes.Rows();
        int ncol = nodes.Cols();
#ifdef PZDEBUG
        if(nrow != 3 || ncol  != 5){
            std::cout << "Objects of incompatible lengths, gradient cannot be computed." << std::endl;
            std::cout << "nodes matrix must be 3x5." << std::endl;
            DebugStop();
        }
        
#endif
        TPZFNMatrix<5,T> phi(5,1);
        TPZFNMatrix<15,T> dphi(3,5);
        TShape(loc,phi,dphi);
        for(int i = 0; i < 5; i++)
        {
            for(int j = 0; j < 3; j++)
            {
                gradx(j,0) += nodes.GetVal(j,i)*dphi(0,i);
                gradx(j,1) += nodes.GetVal(j,i)*dphi(1,i);
                gradx(j,2) += nodes.GetVal(j,i)*dphi(2,i);
            }
        }
        
    }